

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalNinjaGenerator::WriteDyndepFile
          (cmGlobalNinjaGenerator *this,string *dir_top_src,string *dir_top_bld,string *dir_cur_src,
          string *dir_cur_bld,string *arg_dd,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_ddis,string *module_dir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *linked_target_dirs)

{
  cmake *pcVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  cmMakefile *this_00;
  undefined8 uVar5;
  Value *pVVar6;
  Value *pVVar7;
  mapped_type *pmVar8;
  iterator iVar9;
  undefined1 uVar10;
  undefined4 uVar11;
  key_type *pkVar12;
  pointer pcVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  key_type *__k;
  pointer pbVar14;
  const_iterator cVar15;
  allocator local_6a1;
  cmGlobalNinjaGenerator *local_6a0;
  undefined4 local_694;
  string target_mods_file;
  string ltmn;
  Value tm;
  vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_> objects;
  string local_5f8;
  iterator i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mod_files;
  pointer pbStack_580;
  pointer local_578;
  pointer pbStack_570;
  cmNinjaDeps ddOutputs;
  cmNinjaDeps ddImplicitDeps;
  cmNinjaDeps ddOrderOnlyDeps;
  cmNinjaDeps ddExplicitDeps;
  cmGeneratedFileStream tmf;
  Value local_2a0;
  cmGeneratedFileStream ddf;
  undefined4 extraout_var;
  
  pcVar1 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
       (pcVar1->CurrentSnapshot).Position.Position;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)(pcVar1->CurrentSnapshot).State;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (pcVar1->CurrentSnapshot).Position.Tree;
  local_6a0 = (cmGlobalNinjaGenerator *)dir_top_bld;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&ddf,(cmStateSnapshot *)&tmf);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)&ddf,dir_cur_src);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&ddf,(cmStateSnapshot *)&tmf);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&ddf,dir_cur_bld);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&ddf,(cmStateSnapshot *)&tmf);
  cmStateDirectory::SetRelativePathTopSource
            ((cmStateDirectory *)&ddf,(dir_top_src->_M_dataplus)._M_p);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&ddf,(cmStateSnapshot *)&tmf);
  cmStateDirectory::SetRelativePathTopBinary
            ((cmStateDirectory *)&ddf,
             ((_Alloc_hider *)&local_6a0->super_cmGlobalCommonGenerator)->_M_p);
  this_00 = (cmMakefile *)operator_new(0x760);
  cmMakefile::cmMakefile(this_00,(cmGlobalGenerator *)this,(cmStateSnapshot *)&tmf);
  ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)this_00;
  uVar5._0_4_ = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[2])(this,this_00);
  mod_files._M_t._M_impl._0_8_ =
       ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
  uVar5._4_4_ = extraout_var;
  ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0x0;
  std::vector<cmMakefile*,std::allocator<cmMakefile*>>::emplace_back<cmMakefile*>
            ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)
             &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles,
             (cmMakefile **)&mod_files);
  local_6a0 = this;
  mod_files._M_t._M_impl._0_8_ = uVar5;
  std::vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>>::emplace_back<cmLocalGenerator*>
            ((vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>> *)
             &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators,
             (cmLocalGenerator **)&mod_files);
  cm::auto_ptr<cmMakefile>::~auto_ptr((auto_ptr<cmMakefile> *)&ddf);
  objects.super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects.super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects.super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar14 = (arg_ddis->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar14 ==
        (arg_ddis->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &mod_files._M_t._M_impl.super__Rb_tree_header._M_header;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           mod_files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      __lhs = (linked_target_dirs->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      goto LAB_00345f61;
    }
    Json::Value::Value(&tm,nullValue);
    std::ifstream::ifstream(&ddf,(pbVar14->_M_dataplus)._M_p,_S_in|_S_bin);
    Json::Reader::Reader((Reader *)&tmf);
    bVar3 = Json::Reader::parse((Reader *)&tmf,(istream *)&ddf,&tm,false);
    if (bVar3) {
      mod_files._M_t._M_impl._0_8_ =
           &mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           ((ulong)mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
           0xffffffffffffff00);
      local_578 = (pointer)0x0;
      pbStack_570 = (pointer)0x0;
      pbStack_580 = (pointer)0x0;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pVVar6 = Json::Value::operator[](&tm,"object");
      Json::Value::asString_abi_cxx11_(&target_mods_file,pVVar6);
      std::__cxx11::string::operator=((string *)&mod_files,(string *)&target_mods_file);
      std::__cxx11::string::~string((string *)&target_mods_file);
      pVVar6 = Json::Value::operator[](&tm,"provides");
      bVar4 = Json::Value::isArray(pVVar6);
      if (bVar4) {
        cVar15 = Json::Value::begin(pVVar6);
        ltmn._M_dataplus._M_p = (pointer)cVar15.super_ValueIteratorBase.current_._M_node;
        ltmn._M_string_length._0_1_ = cVar15.super_ValueIteratorBase.isNull_;
        while( true ) {
          cVar15 = Json::Value::end(pVVar6);
          target_mods_file._M_dataplus._M_p =
               (pointer)cVar15.super_ValueIteratorBase.current_._M_node;
          target_mods_file._M_string_length =
               CONCAT71(target_mods_file._M_string_length._1_7_,
                        cVar15.super_ValueIteratorBase.isNull_);
          bVar4 = Json::ValueIteratorBase::operator!=
                            ((ValueIteratorBase *)&ltmn,(SelfType *)&target_mods_file);
          if (!bVar4) break;
          pVVar7 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&ltmn);
          Json::Value::asString_abi_cxx11_(&target_mods_file,pVVar7);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                     &target_mods_file);
          std::__cxx11::string::~string((string *)&target_mods_file);
          Json::ValueIteratorBase::increment((ValueIteratorBase *)&ltmn);
        }
      }
      pVVar6 = Json::Value::operator[](&tm,"requires");
      bVar4 = Json::Value::isArray(pVVar6);
      if (bVar4) {
        cVar15 = Json::Value::begin(pVVar6);
        ltmn._M_dataplus._M_p = (pointer)cVar15.super_ValueIteratorBase.current_._M_node;
        ltmn._M_string_length._0_1_ = cVar15.super_ValueIteratorBase.isNull_;
        while( true ) {
          cVar15 = Json::Value::end(pVVar6);
          target_mods_file._M_dataplus._M_p =
               (pointer)cVar15.super_ValueIteratorBase.current_._M_node;
          target_mods_file._M_string_length =
               CONCAT71(target_mods_file._M_string_length._1_7_,
                        cVar15.super_ValueIteratorBase.isNull_);
          bVar4 = Json::ValueIteratorBase::operator!=
                            ((ValueIteratorBase *)&ltmn,(SelfType *)&target_mods_file);
          if (!bVar4) break;
          pVVar7 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&ltmn);
          Json::Value::asString_abi_cxx11_(&target_mods_file,pVVar7);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &pbStack_580,&target_mods_file);
          std::__cxx11::string::~string((string *)&target_mods_file);
          Json::ValueIteratorBase::increment((ValueIteratorBase *)&ltmn);
        }
      }
      std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>::push_back
                (&objects,(value_type *)&mod_files);
      cmFortranObjectInfo::~cmFortranObjectInfo((cmFortranObjectInfo *)&mod_files);
    }
    else {
      pcVar2 = (pbVar14->_M_dataplus)._M_p;
      Json::Reader::getFormattedErrorMessages_abi_cxx11_((string *)&mod_files,(Reader *)&tmf);
      cmSystemTools::Error
                ("-E cmake_ninja_dyndep failed to parse ",pcVar2,
                 (char *)mod_files._M_t._M_impl._0_8_,(char *)0x0);
      std::__cxx11::string::~string((string *)&mod_files);
    }
    Json::Reader::~Reader((Reader *)&tmf);
    std::ifstream::~ifstream(&ddf);
    Json::Value::~Value(&tm);
    pbVar14 = pbVar14 + 1;
  } while (bVar3);
  uVar10 = 0;
  goto LAB_0034657e;
LAB_00345f61:
  bVar3 = __lhs == (linked_target_dirs->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
  local_694 = (undefined4)CONCAT71((int7)((ulong)linked_target_dirs >> 8),bVar3);
  if (bVar3) goto LAB_003460c2;
  std::operator+(&ltmn,__lhs,"/FortranModules.json");
  Json::Value::Value(&tm,nullValue);
  std::ifstream::ifstream(&ddf,ltmn._M_dataplus._M_p,_S_in|_S_bin);
  Json::Reader::Reader((Reader *)&tmf);
  if (((&ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    bVar3 = Json::Reader::parse((Reader *)&tmf,(istream *)&ddf,&tm,false);
    if (!bVar3) {
      pcVar2 = (__lhs->_M_dataplus)._M_p;
      Json::Reader::getFormattedErrorMessages_abi_cxx11_(&target_mods_file,(Reader *)&tmf);
      cmSystemTools::Error
                ("-E cmake_ninja_dyndep failed to parse ",pcVar2,target_mods_file._M_dataplus._M_p,
                 (char *)0x0);
      std::__cxx11::string::~string((string *)&target_mods_file);
      Json::Reader::~Reader((Reader *)&tmf);
      std::ifstream::~ifstream(&ddf);
      Json::Value::~Value(&tm);
      std::__cxx11::string::~string((string *)&ltmn);
      uVar11 = local_694;
      goto LAB_00346571;
    }
  }
  bVar3 = Json::Value::isObject(&tm);
  if (bVar3) {
    Json::Value::begin((Value *)&i);
    while( true ) {
      Json::Value::end((Value *)&target_mods_file);
      bVar3 = Json::ValueIteratorBase::operator!=
                        ((ValueIteratorBase *)&i,(SelfType *)&target_mods_file);
      if (!bVar3) break;
      pVVar6 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&i);
      Json::Value::asString_abi_cxx11_(&local_5f8,pVVar6);
      Json::ValueIteratorBase::key((Value *)&target_mods_file,(ValueIteratorBase *)&i);
      Json::Value::asString_abi_cxx11_((string *)&ddOutputs,(Value *)&target_mods_file);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&mod_files,(string *)&ddOutputs);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_5f8);
      std::__cxx11::string::~string((string *)&ddOutputs);
      Json::Value::~Value((Value *)&target_mods_file);
      std::__cxx11::string::~string((string *)&local_5f8);
      Json::ValueIteratorBase::increment((ValueIteratorBase *)&i);
    }
  }
  Json::Reader::~Reader((Reader *)&tmf);
  std::ifstream::~ifstream(&ddf);
  Json::Value::~Value(&tm);
  std::__cxx11::string::~string((string *)&ltmn);
  __lhs = __lhs + 1;
  goto LAB_00345f61;
LAB_003460c2:
  Json::Value::Value(&tm,objectValue);
  for (pcVar13 = objects.
                 super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pcVar13 !=
      objects.super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_finish; pcVar13 = pcVar13 + 1) {
    for (pkVar12 = (pcVar13->Provides).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pkVar12 !=
        (pcVar13->Provides).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pkVar12 = pkVar12 + 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmf,
                     module_dir,pkVar12);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ddf,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmf,
                     ".mod");
      std::__cxx11::string::~string((string *)&tmf);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&mod_files,pkVar12);
      std::__cxx11::string::_M_assign((string *)pmVar8);
      Json::Value::Value(&local_2a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ddf);
      pVVar6 = Json::Value::operator[](&tm,pkVar12);
      Json::Value::operator=(pVVar6,&local_2a0);
      Json::Value::~Value(&local_2a0);
      std::__cxx11::string::~string((string *)&ddf);
    }
  }
  cmGeneratedFileStream::cmGeneratedFileStream(&ddf,(arg_dd->_M_dataplus)._M_p,false,None);
  std::operator<<((ostream *)&ddf,"ninja_dyndep_version = 1.0\n");
  pcVar13 = objects.super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pcVar13 ==
        objects.super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish) break;
    target_mods_file._M_dataplus._M_p = (pointer)&target_mods_file.field_2;
    target_mods_file._M_string_length = 0;
    target_mods_file.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&ltmn,"dyndep",(allocator *)&tmf);
    ddOutputs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ddOutputs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ddOutputs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    i.super_ValueIteratorBase.current_._M_node = (_Base_ptr)0x0;
    i.super_ValueIteratorBase.isNull_ = false;
    i.super_ValueIteratorBase._9_7_ = 0;
    ddExplicitDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ddExplicitDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ddExplicitDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ddImplicitDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ddImplicitDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ddImplicitDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ddOrderOnlyDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ddOrderOnlyDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ddOrderOnlyDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
         tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ &
         0xffffffff00000000;
    tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
    tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
         &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0;
    tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
         tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&ddOutputs,&pcVar13->Object);
    for (pkVar12 = (pcVar13->Provides).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pkVar12 !=
        (pcVar13->Provides).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pkVar12 = pkVar12 + 1) {
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&mod_files._M_t,pkVar12);
      ConvertToNinjaPath(&local_5f8,local_6a0,pmVar8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&i,&local_5f8)
      ;
      std::__cxx11::string::~string((string *)&local_5f8);
    }
    for (__k = (pcVar13->Requires).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        __k != (pcVar13->Requires).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&mod_files._M_t,__k);
      if ((_Rb_tree_header *)iVar9._M_node != &mod_files._M_t._M_impl.super__Rb_tree_header) {
        ConvertToNinjaPath(&local_5f8,local_6a0,(string *)(iVar9._M_node + 2));
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &ddImplicitDeps,&local_5f8);
        std::__cxx11::string::~string((string *)&local_5f8);
      }
    }
    if ((pcVar13->Provides).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pcVar13->Provides).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)&local_5f8,"restat",&local_6a1);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&tmf,&local_5f8);
      std::__cxx11::string::assign((char *)pmVar8);
      std::__cxx11::string::~string((string *)&local_5f8);
    }
    local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
    local_5f8._M_string_length = 0;
    local_5f8.field_2._M_local_buf[0] = '\0';
    WriteBuild(local_6a0,(ostream *)&ddf,&target_mods_file,&ltmn,&ddOutputs,(cmNinjaDeps *)&i,
               &ddExplicitDeps,&ddImplicitDeps,&ddOrderOnlyDeps,(cmNinjaVars *)&tmf,&local_5f8,0,
               (bool *)0x0);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&tmf);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ddOrderOnlyDeps);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ddImplicitDeps);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ddExplicitDeps);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ddOutputs);
    std::__cxx11::string::~string((string *)&ltmn);
    std::__cxx11::string::~string((string *)&target_mods_file);
    pcVar13 = pcVar13 + 1;
  }
  cmsys::SystemTools::GetFilenamePath((string *)&tmf,arg_dd);
  std::operator+(&target_mods_file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmf,
                 "/FortranModules.json");
  uVar11 = local_694;
  std::__cxx11::string::~string((string *)&tmf);
  cmGeneratedFileStream::cmGeneratedFileStream(&tmf,target_mods_file._M_dataplus._M_p,false,None);
  Json::operator<<((ostream *)&tmf,&tm);
  cmGeneratedFileStream::~cmGeneratedFileStream(&tmf);
  std::__cxx11::string::~string((string *)&target_mods_file);
  cmGeneratedFileStream::~cmGeneratedFileStream(&ddf);
  Json::Value::~Value(&tm);
LAB_00346571:
  uVar10 = (undefined1)uVar11;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&mod_files._M_t);
LAB_0034657e:
  std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>::~vector(&objects);
  return (bool)uVar10;
}

Assistant:

bool cmGlobalNinjaGenerator::WriteDyndepFile(
  std::string const& dir_top_src, std::string const& dir_top_bld,
  std::string const& dir_cur_src, std::string const& dir_cur_bld,
  std::string const& arg_dd, std::vector<std::string> const& arg_ddis,
  std::string const& module_dir,
  std::vector<std::string> const& linked_target_dirs)
{
  // Setup path conversions.
  {
    cmStateSnapshot snapshot = this->GetCMakeInstance()->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentSource(dir_cur_src);
    snapshot.GetDirectory().SetCurrentBinary(dir_cur_bld);
    snapshot.GetDirectory().SetRelativePathTopSource(dir_top_src.c_str());
    snapshot.GetDirectory().SetRelativePathTopBinary(dir_top_bld.c_str());
    CM_AUTO_PTR<cmMakefile> mfd(new cmMakefile(this, snapshot));
    CM_AUTO_PTR<cmLocalNinjaGenerator> lgd(static_cast<cmLocalNinjaGenerator*>(
      this->CreateLocalGenerator(mfd.get())));
    this->Makefiles.push_back(mfd.release());
    this->LocalGenerators.push_back(lgd.release());
  }

  std::vector<cmFortranObjectInfo> objects;
  for (std::vector<std::string>::const_iterator ddii = arg_ddis.begin();
       ddii != arg_ddis.end(); ++ddii) {
    // Load the ddi file and compute the module file paths it provides.
    Json::Value ddio;
    Json::Value const& ddi = ddio;
    cmsys::ifstream ddif(ddii->c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (!reader.parse(ddif, ddio, false)) {
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse ",
                           ddii->c_str(),
                           reader.getFormattedErrorMessages().c_str());
      return false;
    }

    cmFortranObjectInfo info;
    info.Object = ddi["object"].asString();
    Json::Value const& ddi_provides = ddi["provides"];
    if (ddi_provides.isArray()) {
      for (Json::Value::const_iterator i = ddi_provides.begin();
           i != ddi_provides.end(); ++i) {
        info.Provides.push_back(i->asString());
      }
    }
    Json::Value const& ddi_requires = ddi["requires"];
    if (ddi_requires.isArray()) {
      for (Json::Value::const_iterator i = ddi_requires.begin();
           i != ddi_requires.end(); ++i) {
        info.Requires.push_back(i->asString());
      }
    }
    objects.push_back(info);
  }

  // Map from module name to module file path, if known.
  std::map<std::string, std::string> mod_files;

  // Populate the module map with those provided by linked targets first.
  for (std::vector<std::string>::const_iterator di =
         linked_target_dirs.begin();
       di != linked_target_dirs.end(); ++di) {
    std::string const ltmn = *di + "/FortranModules.json";
    Json::Value ltm;
    cmsys::ifstream ltmf(ltmn.c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (ltmf && !reader.parse(ltmf, ltm, false)) {
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse ",
                           di->c_str(),
                           reader.getFormattedErrorMessages().c_str());
      return false;
    }
    if (ltm.isObject()) {
      for (Json::Value::iterator i = ltm.begin(); i != ltm.end(); ++i) {
        mod_files[i.key().asString()] = i->asString();
      }
    }
  }

  // Extend the module map with those provided by this target.
  // We do this after loading the modules provided by linked targets
  // in case we have one of the same name that must be preferred.
  Json::Value tm = Json::objectValue;
  for (std::vector<cmFortranObjectInfo>::iterator oi = objects.begin();
       oi != objects.end(); ++oi) {
    for (std::vector<std::string>::iterator i = oi->Provides.begin();
         i != oi->Provides.end(); ++i) {
      std::string const mod = module_dir + *i + ".mod";
      mod_files[*i] = mod;
      tm[*i] = mod;
    }
  }

  cmGeneratedFileStream ddf(arg_dd.c_str());
  ddf << "ninja_dyndep_version = 1.0\n";

  for (std::vector<cmFortranObjectInfo>::iterator oi = objects.begin();
       oi != objects.end(); ++oi) {
    std::string const ddComment;
    std::string const ddRule = "dyndep";
    cmNinjaDeps ddOutputs;
    cmNinjaDeps ddImplicitOuts;
    cmNinjaDeps ddExplicitDeps;
    cmNinjaDeps ddImplicitDeps;
    cmNinjaDeps ddOrderOnlyDeps;
    cmNinjaVars ddVars;

    ddOutputs.push_back(oi->Object);
    for (std::vector<std::string>::iterator i = oi->Provides.begin();
         i != oi->Provides.end(); ++i) {
      ddImplicitOuts.push_back(this->ConvertToNinjaPath(mod_files[*i]));
    }
    for (std::vector<std::string>::iterator i = oi->Requires.begin();
         i != oi->Requires.end(); ++i) {
      std::map<std::string, std::string>::iterator m = mod_files.find(*i);
      if (m != mod_files.end()) {
        ddImplicitDeps.push_back(this->ConvertToNinjaPath(m->second));
      }
    }
    if (!oi->Provides.empty()) {
      ddVars["restat"] = "1";
    }

    this->WriteBuild(ddf, ddComment, ddRule, ddOutputs, ddImplicitOuts,
                     ddExplicitDeps, ddImplicitDeps, ddOrderOnlyDeps, ddVars);
  }

  // Store the map of modules provided by this target in a file for
  // use by dependents that reference this target in linked-target-dirs.
  std::string const target_mods_file =
    cmSystemTools::GetFilenamePath(arg_dd) + "/FortranModules.json";
  cmGeneratedFileStream tmf(target_mods_file.c_str());
  tmf << tm;

  return true;
}